

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

Matrix<double,_2,_2> * __thiscall
gl4cts::Math::transpose<double,2,2>
          (Matrix<double,_2,_2> *__return_storage_ptr__,Math *this,Matrix<double,_2,_2> *matrix)

{
  Matrix<double,_2,_2> *pMVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  Matrix<double,_2,_2> *result;
  long lVar5;
  bool bVar6;
  uint uVar7;
  
  pMVar1 = __return_storage_ptr__;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  lVar2 = 0;
  pdVar4 = (double *)__return_storage_ptr__;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      uVar7 = 0x3ff00000;
      if (lVar2 != lVar5) {
        uVar7 = 0;
      }
      *(ulong *)((long)pdVar4 + lVar5) = (ulong)uVar7 << 0x20;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 == 0x10);
    pdVar4 = pdVar4 + 1;
    lVar2 = lVar2 + 0x10;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  lVar3 = 0;
  do {
    lVar2 = 0;
    do {
      *(undefined8 *)
       ((long)((Vector<tcu::Vector<double,_2>,_2> *)
              ((Vector<double,_2> *)__return_storage_ptr__)->m_data)->m_data[0].m_data + lVar2) =
           *(undefined8 *)(this + lVar2 * 2);
      lVar2 = lVar2 + 8;
    } while (lVar2 == 8);
    __return_storage_ptr__ = (Matrix<double,_2,_2> *)((long)__return_storage_ptr__ + 0x10);
    this = this + 8;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  return pMVar1;
}

Assistant:

static tcu::Matrix<T, Cols, Rows> transpose(const tcu::Matrix<T, Rows, Cols>& matrix)
{
	tcu::Matrix<T, Cols, Rows> result = tcu::transpose(matrix);

	return result;
}